

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>
           *this,bit_array *x,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last,
          longdouble kappa,longdouble delta,longdouble theta,longdouble objective_amplifier)

{
  uint *args_1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  int *piVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  row_iterator prVar5;
  long lVar6;
  long lVar7;
  rc_data *__first;
  uint r_size;
  rc_data *prVar8;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_c4;
  int local_c0;
  uint local_bc;
  rc_data *local_b8;
  int *local_b0;
  bit_array *local_a8;
  solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>
  *local_a0;
  int *local_98;
  undefined8 local_90;
  undefined1 local_88 [20];
  longdouble local_74;
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  
  local_74 = objective_amplifier;
  local_48 = kappa;
  local_58 = delta;
  local_68 = theta;
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  debug_logger<true>::log<long_double,long_double,long_double>
            ((debug_logger<true> *)this,fmt,&local_48,&local_58,&local_68);
  if (first._M_current == last._M_current) {
    local_90 = 0;
  }
  else {
    local_a0 = this + 0x10;
    local_90 = 0;
    local_a8 = x;
    local_98 = last._M_current;
    do {
      local_c4 = *first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_88,(int)local_a0);
      if (local_88._8_8_ != local_88._0_8_) {
        lVar6 = *(long *)(this + 0x50);
        prVar5 = (row_iterator)local_88._8_8_;
        do {
          piVar1 = &prVar5->value;
          prVar5 = prVar5 + 1;
          lVar7 = (long)*piVar1 * 0x10;
          *(longdouble *)(lVar6 + lVar7) = *(longdouble *)(lVar6 + lVar7) * local_68;
        } while (prVar5 != (row_iterator)local_88._0_8_);
      }
      uVar3 = solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                          *)this,(row_iterator)local_88._8_8_,(row_iterator)local_88._0_8_,x);
      r_size = uVar3;
      if (uVar3 != 0) {
        __first = *(rc_data **)(this + 0x58);
        lVar7 = 0;
        lVar6 = *(long *)(*(long *)(this + 0x70) + 8);
        do {
          *(longdouble *)((long)&__first->value + lVar7) =
               *(longdouble *)((long)&__first->value + lVar7) +
               *(longdouble *)(lVar6 + (long)*(int *)((long)&__first->id + lVar7) * 0x10) * local_74
          ;
          lVar7 = lVar7 + 0x20;
        } while ((ulong)uVar3 << 5 != lVar7);
        if (1 < (int)uVar3) {
          lVar6 = (long)(int)uVar3;
          __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                 (this + 8);
          prVar8 = __first + lVar6;
          local_bc = uVar3;
          local_b0 = first._M_current;
          std::
          __introsort_loop<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,prVar8,(int)LZCOUNT(lVar6) * 2 ^ 0x7e);
          local_b8 = prVar8;
          std::
          __final_insertion_sort<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,prVar8);
          lVar6 = lVar6 * 0x20 + -0x20;
          prVar8 = __first;
          do {
            prVar8 = prVar8 + 1;
            if ((__first->value != prVar8->value) || (NAN(__first->value) || NAN(prVar8->value))) {
              std::
              shuffle<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (__first,prVar8,__g);
              __first = prVar8;
            }
            lVar6 = lVar6 + -0x20;
          } while (lVar6 != 0);
          std::
          shuffle<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (__first,local_b8,__g);
          first._M_current = local_b0;
          r_size = local_bc;
        }
      }
      args_1 = (uint *)(*(long *)(this + 0x60) + (long)local_c4 * 4);
      uVar4 = *args_1;
      if ((int)r_size < (int)uVar4) {
        uVar4 = r_size;
      }
      local_c0 = uVar4 - 1;
      fmt_00._M_str = "constraints {}: {} = ";
      fmt_00._M_len = 0x15;
      debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&local_c4,(int *)args_1);
      if (0 < (int)r_size) {
        lVar6 = 0;
        do {
          fmt_01._M_str = "{} ({}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<long_double,int>
                    ((debug_logger<true> *)this,fmt_01,
                     (longdouble *)(*(long *)(this + 0x58) + lVar6),
                     (int *)(*(long *)(this + 0x58) + 0x10 + lVar6));
          lVar6 = lVar6 + 0x20;
        } while ((ulong)uVar3 << 5 != lVar6);
      }
      fmt_02._M_str = " => Selected: {}\n";
      fmt_02._M_len = 0x11;
      debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&local_c0);
      x = local_a8;
      bVar2 = affect<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                          *)this,local_a8,(row_value *)local_88._8_8_,local_c4,local_c0,r_size,
                         local_48,local_58);
      first._M_current = first._M_current + 1;
      local_90 = CONCAT71((int7)((ulong)local_90 >> 8),(byte)local_90 | bVar2);
    } while (first._M_current != local_98);
  }
  return (bool)((byte)local_90 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k]);

            logger::log("constraints {}: {} = ", k, b[k]);

            for (int i = 0; i < r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }